

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O3

FeatureType __thiscall
CoreML::FeatureType::Array
          (FeatureType *this,vector<long,_std::allocator<long>_> *shape,MLArrayDataType dataType)

{
  FeatureType *this_00;
  long *plVar1;
  long lVar2;
  ArrayFeatureType *this_01;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  uint uVar5;
  long *plVar6;
  FeatureType FVar7;
  
  FeatureType(this,MLFeatureTypeType_multiArrayType);
  this_00 = (this->m_type).
            super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00->_oneof_case_[0] == 5) {
    this_01 = (this_00->Type_).multiarraytype_;
    _Var4._M_pi = extraout_RDX;
  }
  else {
    Specification::FeatureType::clear_Type(this_00);
    this_00->_oneof_case_[0] = 5;
    this_01 = (ArrayFeatureType *)operator_new(0x48);
    Specification::ArrayFeatureType::ArrayFeatureType(this_01);
    (this_00->Type_).multiarraytype_ = this_01;
    _Var4._M_pi = extraout_RDX_00;
  }
  plVar6 = (shape->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  plVar1 = (shape->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (plVar6 != plVar1) {
    uVar5 = (this_01->shape_).current_size_;
    do {
      lVar2 = *plVar6;
      if (uVar5 == (this_01->shape_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(&this_01->shape_,uVar5 + 1);
        uVar5 = (this_01->shape_).current_size_;
      }
      lVar3 = (long)(int)uVar5;
      uVar5 = uVar5 + 1;
      _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar5;
      (this_01->shape_).current_size_ = uVar5;
      ((this_01->shape_).rep_)->elements[lVar3] = lVar2;
      plVar6 = plVar6 + 1;
    } while (plVar6 != plVar1);
  }
  this_01->datatype_ = dataType;
  FVar7.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  FVar7.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (FeatureType)
         FVar7.m_type.
         super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FeatureType FeatureType::Array(const std::vector<int64_t> shape, MLArrayDataType dataType) {
        FeatureType out(MLFeatureTypeType_multiArrayType);
        Specification::ArrayFeatureType *params = out->mutable_multiarraytype();
        
        for (int64_t s : shape) {
            params->add_shape(s);
        }
        params->set_datatype(static_cast<Specification::ArrayFeatureType::ArrayDataType>(dataType));
        return out;
    }